

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChannelEvent.cpp
# Opt level: O1

DataBuffer * __thiscall
MIDI::ChannelEvent::data(DataBuffer *__return_storage_ptr__,ChannelEvent *this,bool shorten)

{
  size_t in_RCX;
  undefined3 in_register_00000011;
  undefined4 extraout_EDX;
  undefined4 extraout_EDX_00;
  undefined4 uVar1;
  undefined4 extraout_EDX_01;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 uVar2;
  undefined4 extraout_var_01;
  
  Event::data(__return_storage_ptr__,&this->super_Event);
  uVar1 = extraout_EDX;
  uVar2 = extraout_var;
  if (CONCAT31(in_register_00000011,shorten) == 0) {
    DataBuffer::write(__return_storage_ptr__,
                      (uint)(byte)(this->_command * '\x10' + (char)this->_channel),
                      (void *)CONCAT44(extraout_var,extraout_EDX),in_RCX);
    uVar1 = extraout_EDX_00;
    uVar2 = extraout_var_00;
  }
  DataBuffer::write(__return_storage_ptr__,(uint)(byte)this->_param1,(void *)CONCAT44(uVar2,uVar1),
                    in_RCX);
  DataBuffer::write(__return_storage_ptr__,(uint)(byte)this->_param2,
                    (void *)CONCAT44(extraout_var_01,extraout_EDX_01),in_RCX);
  return __return_storage_ptr__;
}

Assistant:

DataBuffer ChannelEvent::data(bool shorten)
  {
    DataBuffer data=Event::data();
    
    if(!shorten)
      {
	byte typething=_command;
	typething=(typething<<4);
	typething+=_channel;
	data.write(typething);
      }
    data.write(_param1);
    data.write(_param2);
    
    return data;
  }